

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result wabt::ParseWatModule
                 (WastLexer *lexer,
                 unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *out_module,
                 Errors *errors,WastParseOptions *options)

{
  Result RVar1;
  Result RVar2;
  WastParser parser;
  WastParser local_100;
  
  if (out_module == (unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)0x0) {
    __assert_fail("out_module != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                  ,0xf3d,
                  "Result wabt::ParseWatModule(WastLexer *, std::unique_ptr<Module> *, Errors *, WastParseOptions *)"
                 );
  }
  if (options != (WastParseOptions *)0x0) {
    local_100.last_module_index_ = 0xffffffff;
    local_100.lexer_ = lexer;
    local_100.errors_ = errors;
    local_100.options_ = options;
    memset(&local_100.resolve_types_,0,200);
    RVar1 = WastParser::ParseModule(&local_100,out_module);
    std::vector<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>::
    ~vector(&local_100.resolve_funcs_);
    std::vector<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>::
    ~vector(&local_100.resolve_types_);
    RVar2.enum_._1_3_ = 0;
    RVar2.enum_._0_1_ = RVar1.enum_ == Error;
    return (Result)RVar2.enum_;
  }
  __assert_fail("options != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                ,0xf3e,
                "Result wabt::ParseWatModule(WastLexer *, std::unique_ptr<Module> *, Errors *, WastParseOptions *)"
               );
}

Assistant:

Result ParseWatModule(WastLexer* lexer,
                      std::unique_ptr<Module>* out_module,
                      Errors* errors,
                      WastParseOptions* options) {
  assert(out_module != nullptr);
  assert(options != nullptr);
  WastParser parser(lexer, errors, options);
  CHECK_RESULT(parser.ParseModule(out_module));
  return Result::Ok;
}